

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argv_parser.h
# Opt level: O0

void __thiscall args_t::~args_t(args_t *this)

{
  int local_14;
  int i;
  args_t *this_local;
  
  for (local_14 = 0; local_14 < this->argc; local_14 = local_14 + 1) {
    if (this->argv[local_14] != (char *)0x0) {
      operator_delete__(this->argv[local_14]);
    }
  }
  if (this->argv != (char **)0x0) {
    operator_delete__(this->argv);
  }
  return;
}

Assistant:

~args_t() {
        for (int i = 0; i < argc; i++) {
            delete[] argv[i];
        }
        delete[] argv;
    }